

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void anon_unknown.dwarf_2926b4::fillHeader(Header *header,char *sender,char *target,int seq)

{
  char *pcVar1;
  char *this;
  FieldBase local_200;
  UTCTIMESTAMP local_1a8;
  FieldBase local_190;
  allocator<char> local_131;
  STRING local_130;
  FieldBase local_110;
  allocator<char> local_a1;
  STRING local_a0;
  FieldBase local_80;
  int local_24;
  char *pcStack_20;
  int seq_local;
  char *target_local;
  char *sender_local;
  Header *header_local;
  
  local_24 = seq;
  pcStack_20 = target;
  target_local = sender;
  sender_local = (char *)header;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,sender,&local_a1);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_80,&local_a0);
  FIX::FieldMap::setField(&header->super_FieldMap,&local_80,true);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  this = sender_local;
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar1,&local_131);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_110,&local_130);
  FIX::FieldMap::setField((FieldMap *)this,&local_110,true);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pcVar1 = sender_local;
  FIX::UtcTimeStamp::now();
  FIX::SendingTime::SendingTime((SendingTime *)&local_190,&local_1a8);
  FIX::FieldMap::setField((FieldMap *)pcVar1,&local_190,true);
  FIX::SendingTime::~SendingTime((SendingTime *)&local_190);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_1a8);
  pcVar1 = sender_local;
  FIX::MsgSeqNum::MsgSeqNum((MsgSeqNum *)&local_200,(long)local_24);
  FIX::FieldMap::setField((FieldMap *)pcVar1,&local_200,true);
  FIX::MsgSeqNum::~MsgSeqNum((MsgSeqNum *)&local_200);
  return;
}

Assistant:

void fillHeader(FIX::Header &header, const char *sender, const char *target, int seq) {
  header.setField(SenderCompID(sender));
  header.setField(TargetCompID(target));
  header.setField(SendingTime(UtcTimeStamp::now()));
  header.setField(MsgSeqNum(seq));
}